

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JHandler.h
# Opt level: O0

void __thiscall JHandler::JHandler(JHandler *this)

{
  JHandler *this_local;
  
  std::make_shared<JHandler::url>();
  std::make_shared<JHandler::metadata>();
  std::__cxx11::string::string((string *)&this->error_msg);
  return;
}

Assistant:

JHandler() = default;